

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockPluginTest.cpp
# Opt level: O3

void __thiscall
TEST_MockPlugin_checkExpectationsAndClearAtEnd_Test::
TEST_MockPlugin_checkExpectationsAndClearAtEnd_Test
          (TEST_MockPlugin_checkExpectationsAndClearAtEnd_Test *this)

{
  SimpleString SStack_28;
  
  (this->super_TEST_GROUP_CppUTestGroupMockPlugin).plugin.repository_.
  _vptr_MockNamedValueComparatorsAndCopiersRepository = (_func_int **)0x0;
  (this->super_TEST_GROUP_CppUTestGroupMockPlugin).plugin.repository_.head_ =
       (MockNamedValueComparatorsAndCopiersRepositoryNode *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupMockPlugin).plugin.super_TestPlugin.name_.bufferSize_ = 0;
  *(undefined8 *)&(this->super_TEST_GROUP_CppUTestGroupMockPlugin).plugin.super_TestPlugin.enabled_
       = 0;
  (this->super_TEST_GROUP_CppUTestGroupMockPlugin).plugin.super_TestPlugin.next_ = (TestPlugin *)0x0
  ;
  (this->super_TEST_GROUP_CppUTestGroupMockPlugin).plugin.super_TestPlugin.name_.buffer_ =
       (char *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupMockPlugin).result = (TestResult *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupMockPlugin).plugin.super_TestPlugin._vptr_TestPlugin =
       (_func_int **)0x0;
  (this->super_TEST_GROUP_CppUTestGroupMockPlugin).output.output.bufferSize_ = 0;
  (this->super_TEST_GROUP_CppUTestGroupMockPlugin).test = (UtestShell *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupMockPlugin).output.super_TestOutput.progressIndication_ =
       (char *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupMockPlugin).output.output.buffer_ = (char *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupMockPlugin).output.super_TestOutput.dotCount_ = 0;
  (this->super_TEST_GROUP_CppUTestGroupMockPlugin).output.super_TestOutput.verbose_ = level_quiet;
  *(undefined8 *)&(this->super_TEST_GROUP_CppUTestGroupMockPlugin).output.super_TestOutput.color_ =
       0;
  (this->super_TEST_GROUP_CppUTestGroupMockPlugin).super_Utest._vptr_Utest = (_func_int **)0x0;
  (this->super_TEST_GROUP_CppUTestGroupMockPlugin).output.super_TestOutput._vptr_TestOutput =
       (_func_int **)0x0;
  Utest::Utest((Utest *)this);
  (this->super_TEST_GROUP_CppUTestGroupMockPlugin).super_Utest._vptr_Utest =
       (_func_int **)&PTR__TEST_GROUP_CppUTestGroupMockPlugin_002cadc0;
  StringBufferTestOutput::StringBufferTestOutput
            (&(this->super_TEST_GROUP_CppUTestGroupMockPlugin).output);
  SimpleString::SimpleString(&SStack_28,"MockSupportPLugin");
  MockSupportPlugin::MockSupportPlugin
            (&(this->super_TEST_GROUP_CppUTestGroupMockPlugin).plugin,&SStack_28);
  SimpleString::~SimpleString(&SStack_28);
  (this->super_TEST_GROUP_CppUTestGroupMockPlugin).super_Utest._vptr_Utest =
       (_func_int **)&PTR__TEST_GROUP_CppUTestGroupMockPlugin_002caa20;
  return;
}

Assistant:

TEST(MockPlugin, checkExpectationsAndClearAtEnd)
{
    MockFailureReporterInstaller failureReporterInstaller;

    MockExpectedCallsListForTest expectations;
    expectations.addFunction("foobar");
    MockExpectedCallsDidntHappenFailure expectedFailure(test, expectations);

    mock().expectOneCall("foobar");

    plugin.postTestAction(*test, *result);

    STRCMP_CONTAINS(expectedFailure.getMessage().asCharString(), output.getOutput().asCharString());
    LONGS_EQUAL(0, mock().expectedCallsLeft());
    CHECK_NO_MOCK_FAILURE();
}